

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

Matrix<double> __thiscall Matrix<double>::Inverse(Matrix<double> *this)

{
  int a;
  double *pdVar1;
  double **ppdVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double **extraout_RDX;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int *in_RSI;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int j;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  double *pdVar17;
  undefined8 *puVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  Matrix<double> MVar23;
  Matrix<double> A;
  Matrix<double> MStack_48;
  int *local_38;
  
  Matrix(&MStack_48,*in_RSI,*in_RSI * 2);
  a = *in_RSI;
  uVar5 = (ulong)a;
  if (0 < (long)uVar5) {
    lVar11 = *(long *)(in_RSI + 2);
    uVar10 = 0;
    do {
      lVar13 = *(long *)(lVar11 + uVar10 * 8);
      pdVar17 = MStack_48.M[uVar10];
      uVar14 = 0;
      do {
        pdVar17[uVar14] = *(double *)(lVar13 + uVar14 * 8);
        uVar14 = uVar14 + 1;
      } while (uVar5 != uVar14);
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar5);
  }
  if (0 < a) {
    lVar11 = 0;
    do {
      *(undefined8 *)(lVar11 + *(long *)((long)MStack_48.M + lVar11) + uVar5 * 8) =
           0x3ff0000000000000;
      lVar11 = lVar11 + 8;
    } while (uVar5 * 8 - lVar11 != 0);
  }
  if (0 < a) {
    uVar4 = (ulong)(uint)(a * 2);
    uVar12 = 1;
    lVar11 = 0;
    uVar10 = uVar4;
    uVar14 = 0;
    do {
      pdVar17 = MStack_48.M[uVar14];
      uVar15 = uVar14 + 1;
      iVar6 = (int)uVar14;
      if (uVar15 < uVar5) {
        dVar21 = ABS(pdVar17[uVar14]);
        uVar8 = uVar14 & 0xffffffff;
        uVar19 = uVar12;
        do {
          dVar22 = ABS(MStack_48.M[uVar19][uVar14]);
          uVar20 = -(ulong)(dVar21 < dVar22);
          if (dVar21 < dVar22) {
            uVar8 = uVar19 & 0xffffffff;
          }
          iVar6 = (int)uVar8;
          dVar21 = (double)(~uVar20 & (ulong)dVar21 | (ulong)MStack_48.M[uVar19][uVar14] & uVar20);
          uVar19 = uVar19 + 1;
        } while (uVar5 != uVar19);
      }
      if (uVar14 < uVar4) {
        pdVar1 = MStack_48.M[iVar6];
        uVar19 = uVar14;
        do {
          dVar21 = pdVar1[uVar19];
          pdVar1[uVar19] = pdVar17[uVar19];
          pdVar17[uVar19] = dVar21;
          uVar19 = uVar19 + 1;
        } while (uVar4 != uVar19);
      }
      uVar19 = uVar12;
      if (uVar15 < uVar5) {
        do {
          if (uVar14 < uVar4) {
            dVar21 = MStack_48.M[uVar19][uVar14];
            dVar22 = pdVar17[uVar14];
            puVar18 = (undefined8 *)((long)MStack_48.M[uVar19] + lVar11);
            uVar8 = 0;
            do {
              if (uVar8 == 0) {
                *puVar18 = 0;
              }
              else {
                puVar18[uVar8] =
                     *(double *)((long)pdVar17 + uVar8 * 8 + lVar11) * (-dVar21 / dVar22) +
                     (double)puVar18[uVar8];
              }
              uVar8 = uVar8 + 1;
            } while (uVar10 != uVar8);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar5);
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 8;
      uVar10 = uVar10 - 1;
      uVar14 = uVar15;
    } while (uVar15 != uVar5);
  }
  if (0 < a) {
    iVar6 = a * 2;
    uVar9 = a - 2;
    uVar10 = uVar5;
    do {
      uVar14 = uVar10 - 1;
      if (SBORROW4(a,iVar6) != 0 < a) {
        pdVar1 = MStack_48.M[uVar14];
        pdVar17 = pdVar1 + uVar5;
        iVar7 = a;
        do {
          *pdVar17 = *pdVar17 / pdVar1[uVar14];
          pdVar17 = pdVar17 + 1;
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar6);
      }
      uVar4 = (ulong)uVar9;
      if (1 < (long)uVar10) {
        do {
          if (SBORROW4(a,iVar6) != 0 < a) {
            pdVar17 = MStack_48.M[uVar4];
            pdVar1 = MStack_48.M[uVar14];
            lVar11 = 0;
            do {
              pdVar17[uVar5 + lVar11] =
                   pdVar17[uVar5 + lVar11] - pdVar1[uVar5 + lVar11] * pdVar17[uVar14];
              lVar11 = lVar11 + 1;
            } while (a + (int)lVar11 < iVar6);
          }
          iVar7 = (int)uVar4;
          uVar4 = uVar4 - 1;
        } while (0 < iVar7);
      }
      uVar9 = uVar9 - 1;
      bVar3 = 1 < (long)uVar10;
      uVar10 = uVar14;
    } while (bVar3);
  }
  local_38 = in_RSI;
  Matrix(this,a,a);
  lVar11 = (long)*local_38;
  if (0 < lVar11) {
    ppdVar2 = this->M;
    lVar13 = 0;
    do {
      pdVar17 = ppdVar2[lVar13];
      pdVar1 = MStack_48.M[lVar13];
      lVar16 = 0;
      do {
        pdVar17[lVar16] = pdVar1[lVar11 + lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar11 != lVar16);
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar11);
  }
  ~Matrix(&MStack_48);
  MVar23.M = extraout_RDX;
  MVar23._0_8_ = this;
  return MVar23;
}

Assistant:

Matrix Inverse() const {
    Matrix<T> A(n, 2 * n);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < n; j++) {
        A.M[i][j] = M[i][j];
      }
    }
    for (int i = 0; i < n; i++) {
      A.M[i][n + i] = 1;
    }

    for (int i = 0; i < n; i++) {
      double maxEl = abs(A.M[i][i]);
      int maxRow = i;
      for (int k = i + 1; k < n; k++) {
        if (abs(A.M[k][i]) > maxEl) {
          maxEl = A.M[k][i];
          maxRow = k;
        }
      }

      for (int k = i; k < 2 * n; k++) {
        double tmp = A.M[maxRow][k];
        A.M[maxRow][k] = A.M[i][k];
        A.M[i][k] = tmp;
      }

      for (int k = i + 1; k < n; k++) {
        double c = -A.M[k][i] / A.M[i][i];
        for (int j = i; j < 2 * n; j++) {
          if (i == j) {
            A.M[k][j] = 0;
          } else {
            A.M[k][j] += c * A.M[i][j];
          }
        }
      }
    }

    for (int i = n - 1; i >= 0; i--) {
      for (int k = n; k < 2 * n; k++) {
        A.M[i][k] /= A.M[i][i];
      }
      for (int rowMod = i - 1; rowMod >= 0; rowMod--) {
        for (int columMod = n; columMod < 2 * n; columMod++) {
          A.M[rowMod][columMod] -= A.M[i][columMod] * A.M[rowMod][i];
        }
      }
    }

    Matrix<T> Inv(n, n);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < n; j++) {
        Inv.M[i][j] = A.M[i][j + n];
      }
    }
    return Inv;
  }